

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_CCtx_reset(ZSTD_CCtx *cctx,ZSTD_ResetDirective reset)

{
  size_t sVar1;
  
  if ((reset & ~ZSTD_reset_parameters) == ZSTD_reset_session_only) {
    cctx->streamStage = zcss_init;
    cctx->pledgedSrcSizePlusOne = 0;
  }
  if ((reset & ~ZSTD_reset_session_only) == ZSTD_reset_parameters) {
    sVar1 = 0xffffffffffffffc4;
    if (cctx->streamStage == zcss_init) {
      ZSTD_clearAllDicts(cctx);
      sVar1 = 0;
      switchD_010444a0::default(&cctx->requestedParams,0,0xd8);
      (cctx->requestedParams).compressionLevel = 3;
      (cctx->requestedParams).fParams.contentSizeFlag = 1;
    }
  }
  else {
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_CCtx_reset(ZSTD_CCtx* cctx, ZSTD_ResetDirective reset)
{
    if ( (reset == ZSTD_reset_session_only)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        cctx->streamStage = zcss_init;
        cctx->pledgedSrcSizePlusOne = 0;
    }
    if ( (reset == ZSTD_reset_parameters)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong,
                        "Reset parameters is only possible during init stage.");
        ZSTD_clearAllDicts(cctx);
        return ZSTD_CCtxParams_reset(&cctx->requestedParams);
    }
    return 0;
}